

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_getuint32(jas_stream_t *in,uint_fast32_t *val)

{
  byte *pbVar1;
  int iVar2;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  int c;
  uint_fast32_t v;
  uint_fast32_t *val_local;
  jas_stream_t *in_local;
  
  if ((in->flags_ & 7U) == 0) {
    if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
      iVar2 = in->cnt_ + -1;
      in->cnt_ = iVar2;
      if (iVar2 < 0) {
        local_34 = jas_stream_fillbuf(in,1);
      }
      else {
        in->rwcnt_ = in->rwcnt_ + 1;
        pbVar1 = in->ptr_;
        in->ptr_ = pbVar1 + 1;
        local_34 = (uint)*pbVar1;
      }
      local_30 = local_34;
    }
    else {
      in->flags_ = in->flags_ | 4;
      local_30 = 0xffffffff;
    }
    local_38 = local_30;
  }
  else {
    local_38 = 0xffffffff;
  }
  if (local_38 == 0xffffffff) {
    in_local._4_4_ = -1;
  }
  else {
    if ((in->flags_ & 7U) == 0) {
      if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
        iVar2 = in->cnt_ + -1;
        in->cnt_ = iVar2;
        if (iVar2 < 0) {
          local_40 = jas_stream_fillbuf(in,1);
        }
        else {
          in->rwcnt_ = in->rwcnt_ + 1;
          pbVar1 = in->ptr_;
          in->ptr_ = pbVar1 + 1;
          local_40 = (uint)*pbVar1;
        }
        local_3c = local_40;
      }
      else {
        in->flags_ = in->flags_ | 4;
        local_3c = 0xffffffff;
      }
      local_44 = local_3c;
    }
    else {
      local_44 = 0xffffffff;
    }
    if (local_44 == 0xffffffff) {
      in_local._4_4_ = -1;
    }
    else {
      if ((in->flags_ & 7U) == 0) {
        if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
          iVar2 = in->cnt_ + -1;
          in->cnt_ = iVar2;
          if (iVar2 < 0) {
            local_4c = jas_stream_fillbuf(in,1);
          }
          else {
            in->rwcnt_ = in->rwcnt_ + 1;
            pbVar1 = in->ptr_;
            in->ptr_ = pbVar1 + 1;
            local_4c = (uint)*pbVar1;
          }
          local_48 = local_4c;
        }
        else {
          in->flags_ = in->flags_ | 4;
          local_48 = 0xffffffff;
        }
        local_50 = local_48;
      }
      else {
        local_50 = 0xffffffff;
      }
      if (local_50 == 0xffffffff) {
        in_local._4_4_ = -1;
      }
      else {
        if ((in->flags_ & 7U) == 0) {
          if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
            iVar2 = in->cnt_ + -1;
            in->cnt_ = iVar2;
            if (iVar2 < 0) {
              local_58 = jas_stream_fillbuf(in,1);
            }
            else {
              in->rwcnt_ = in->rwcnt_ + 1;
              pbVar1 = in->ptr_;
              in->ptr_ = pbVar1 + 1;
              local_58 = (uint)*pbVar1;
            }
            local_54 = local_58;
          }
          else {
            in->flags_ = in->flags_ | 4;
            local_54 = 0xffffffff;
          }
          local_5c = local_54;
        }
        else {
          local_5c = 0xffffffff;
        }
        if (local_5c == 0xffffffff) {
          in_local._4_4_ = -1;
        }
        else {
          if (val != (uint_fast32_t *)0x0) {
            *val = (((long)(int)local_38 << 8 | (long)(int)local_44) << 8 | (long)(int)local_50) <<
                   8 | (long)(int)local_5c;
          }
          in_local._4_4_ = 0;
        }
      }
    }
  }
  return in_local._4_4_;
}

Assistant:

int jpc_getuint32(jas_stream_t *in, uint_fast32_t *val)
{
	uint_fast32_t v;
	int c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = (v << 8) | c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = (v << 8) | c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = (v << 8) | c;
	if (val) {
		*val = v;
	}
	return 0;
}